

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

double lerch(double z,int s,double a)

{
  double dVar1;
  double local_50;
  double z_k;
  double term;
  double total;
  int k;
  double eps;
  double a_local;
  int s_local;
  double z_local;
  
  term = 0.0;
  if (z <= 0.0) {
    return 0.0;
  }
  total._4_4_ = 0;
  local_50 = 1.0;
  do {
    if ((a + (double)total._4_4_ != 0.0) || (NAN(a + (double)total._4_4_))) {
      dVar1 = pow(a + (double)total._4_4_,(double)s);
      term = term + local_50 / dVar1;
      if (ABS(local_50 / dVar1) <= (ABS(term) + 1.0) * 1e-10) {
        return term;
      }
    }
    total._4_4_ = total._4_4_ + 1;
    local_50 = local_50 * z;
  } while( true );
}

Assistant:

BURKHARDT_EXPORT
double lerch ( double z, int s, double a )

//****************************************************************************80
//
//  Purpose:
//
//    LERCH estimates the Lerch transcendent function.
//
//  Definition:
//
//    The Lerch transcendent function is defined as:
//
//      LERCH ( Z, S, A ) = Sum ( 0 <= K < +oo ) Z^K / ( A + K )^S
//
//    excluding any term with ( A + K ) = 0.
//
//    In Mathematica, the function can be evaluated by:
//
//      LerchPhi[z,s,a]
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    13 May 2005
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Eric Weisstein,
//    CRC Concise Encyclopedia of Mathematics,
//    CRC Press, 2002,
//    Second edition,
//    ISBN: 1584883472,
//    LC: QA5.W45.
//
//  Thanks:
//
//    Oscar van Vlijmen
//
//  Parameters:
//
//    Input, double Z, int S, double A, the parameters of the function.
//
//    Output, double LERCH, an approximation to the Lerch
//    transcendent function.
//
{
  double eps = 1.0E-10;
  int k;
  double total;
  double term;
  double z_k;

  total = 0.0;

  if ( z <= 0.0 )
  {
    return total;
  }

  k = 0;
  z_k = 1.0;

  for ( ; ; )
  {
    if ( a + double( k ) != 0.0 )
    {
      term = z_k / pow ( a + double(k), s );

      total = total + term;

      if ( fabs ( term ) <= eps * ( 1.0 + fabs ( total ) ) )
      {
        break;
      }
    }

    k = k + 1;
    z_k = z_k * z;

  }

  return total;
}